

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(void)

{
  size_type sVar1;
  pointer pdVar2;
  Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pEVar3;
  ostream *poVar4;
  long lVar5;
  double *it;
  size_type sVar6;
  pointer pdVar7;
  initializer_list<double> __l;
  string buf0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> out3;
  string out2;
  vector<double,_std::allocator<double>_> dout5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out4;
  vector<double,_std::allocator<double>_> buf2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dout4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> dout3;
  string out1;
  Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> e2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  string buf;
  string dout1;
  string brand;
  Decoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> d2;
  Decoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> d1;
  Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> e1;
  string words [4];
  decode_state local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&brand,"YukiWorkshop",(allocator<char> *)words);
  out1._M_dataplus._M_p = (pointer)&out1.field_2;
  out1._M_string_length = 0;
  out1.field_2._M_local_buf[0] = '\0';
  YukiWorkshop::Base64X::
  Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Encoder
            (&e1);
  e1.output_target = &out1;
  pEVar3 = YukiWorkshop::Base64X::operator<<(&e1,&brand);
  pEVar3 = YukiWorkshop::Base64X::operator<<(pEVar3," ");
  pEVar3 = YukiWorkshop::Base64X::operator<<(pEVar3,"Rocks!");
  YukiWorkshop::Base64X::operator<<(pEVar3,(char *)0x0);
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)&out1);
  std::operator<<(poVar4,"\n");
  dout1._M_dataplus._M_p = (pointer)&dout1.field_2;
  dout1._M_string_length = 0;
  dout1.field_2._M_local_buf[0] = '\0';
  YukiWorkshop::Base64X::
  Decoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Decoder
            (&d1);
  d1.output_target = &dout1;
  YukiWorkshop::Base64X::operator<<(&d1,&out1);
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)&dout1);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"Austin!",(allocator<char> *)words);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&v,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )buf._M_dataplus._M_p,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(buf._M_dataplus._M_p + buf._M_string_length),(allocator_type *)words);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)words,"Hey ",(allocator<char> *)&out2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(words + 1),"guys, ",(allocator<char> *)&buf0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(words + 2),"this is ",(allocator<char> *)&out3);
  words[3]._M_dataplus._M_p = (pointer)&words[3].field_2;
  words[3]._M_string_length = 0;
  words[3].field_2._M_local_buf[0] = '\0';
  out2._M_dataplus._M_p = (pointer)&out2.field_2;
  out2._M_string_length = 0;
  out2.field_2._M_local_buf[0] = '\0';
  YukiWorkshop::Base64X::
  Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Encoder
            (&e2);
  for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 0x20) {
    YukiWorkshop::Base64X::Encoder<std::__cxx11::string>::encode<std::__cxx11::string>
              (&buf0,&e2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&words[0]._M_dataplus._M_p + lVar5));
    std::__cxx11::string::append((string *)&out2);
    std::__cxx11::string::~string((string *)&buf0);
  }
  YukiWorkshop::Base64X::Encoder<std::__cxx11::string>::
  encode<unsigned_char,std::allocator<unsigned_char>>(&buf0,&e2,&v);
  std::__cxx11::string::append((string *)&out2);
  std::__cxx11::string::~string((string *)&buf0);
  YukiWorkshop::Base64X::
  Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  finalize(&buf0,&e2);
  std::__cxx11::string::append((string *)&out2);
  std::__cxx11::string::~string((string *)&buf0);
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)&out2);
  std::operator<<(poVar4,"\n");
  YukiWorkshop::Base64X::
  Decoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Decoder
            (&d2);
  sVar1 = out2._M_string_length;
  for (sVar6 = 0; sVar1 != sVar6; sVar6 = sVar6 + 1) {
    buf0._M_dataplus._M_p = (pointer)&buf0.field_2;
    buf0._M_string_length = 0;
    buf0.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::push_back((char)&buf0);
    YukiWorkshop::Base64X::Decoder<std::__cxx11::string>::decode<std::__cxx11::string>
              (&out3,&d2,&buf0);
    std::operator<<((ostream *)&std::cout,(string *)&out3);
    std::__cxx11::string::~string((string *)&out3);
    std::__cxx11::string::~string((string *)&buf0);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf0,"roses are red",(allocator<char> *)&out3);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&buf1,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )buf0._M_dataplus._M_p,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(buf0._M_dataplus._M_p + buf0._M_string_length),(allocator_type *)&out3);
  dout3._M_string_length =
       (long)buf1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)buf1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  dout3._M_dataplus._M_p =
       (pointer)buf1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  YukiWorkshop::Base64X::encode_state::as<std::__cxx11::string>(&out3,(encode_state *)&dout3);
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)&out3);
  std::operator<<(poVar4,"\n");
  dout3._0_16_ = YukiWorkshop::Base64X::encode("violets are blue");
  YukiWorkshop::Base64X::encode_state::as<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&out4,(encode_state *)&dout3);
  fwrite(out4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,1,
         (long)out4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)out4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,_stdout);
  fputc(10,_stdout);
  out5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)out3._M_dataplus._M_p;
  out5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)out3._M_string_length;
  YukiWorkshop::Base64X::decode_state::as<std::__cxx11::string>(&dout3,(decode_state *)&out5);
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)&dout3);
  std::operator<<(poVar4,"\n");
  out5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       out4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish +
       -(long)out4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
  out5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       out4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  YukiWorkshop::Base64X::decode_state::as<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&dout4,(decode_state *)&out5);
  fwrite(dout4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,1,
         (long)dout4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)dout4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,_stdout);
  fputc(10,_stdout);
  out5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x406d2774bc6a7efa;
  out5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x400921fb54437efe;
  out5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x404535c28f5c28f6;
  __l._M_len = 4;
  __l._M_array = (iterator)&out5;
  std::vector<double,_std::allocator<double>_>::vector(&buf2,__l,(allocator_type *)&dout5);
  dout5.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((long)buf2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)buf2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start);
  dout5.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = buf2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start;
  YukiWorkshop::Base64X::encode_state::as<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&out5,(encode_state *)&dout5);
  fwrite(out5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,1,
         (long)out5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)out5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,_stdout);
  fputc(10,_stdout);
  local_40.len_ =
       (long)out5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)out5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_40.buf_ =
       (char *)out5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
  YukiWorkshop::Base64X::decode_state::as_vector<double,std::allocator<double>>(&dout5,&local_40);
  pdVar2 = dout5.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  for (pdVar7 = dout5.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar7 != pdVar2; pdVar7 = pdVar7 + 1) {
    poVar4 = std::ostream::_M_insert<double>(*pdVar7);
    std::operator<<(poVar4," ");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&dout5.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&out5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&buf2.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&dout4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&dout3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&out4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&out3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buf1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&buf0);
  std::__cxx11::string::~string((string *)&out2);
  lVar5 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&words[0]._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::~string((string *)&dout1);
  std::__cxx11::string::~string((string *)&out1);
  std::__cxx11::string::~string((string *)&brand);
  return 0;
}

Assistant:

int main() {
	// Example 1
	// Encode
	std::string brand = "YukiWorkshop";
	std::string out1;
	Base64X::Encoder<std::string> e1;
	e1 >> out1;
	e1 << brand << " " << "Rocks!" << nullptr;
	std::cout << out1 << "\n";

	// Decode
	std::string dout1;
	Base64X::Decoder<std::string> d1;
	d1 >> dout1;
	d1 << out1;
	std::cout << dout1 << "\n";


	// Example 2
	// Encode
	std::string buf = "Austin!";
	std::vector<uint8_t> v(buf.begin(), buf.end());
	std::string words[4] = { "Hey ", "guys, ", "this is "};
	std::string out2;
	Base64X::Encoder<std::string> e2;
	for (auto &word : words) {
		out2 += e2.encode(word);
	}
	out2 += e2.encode(v);
	out2 += e2.finalize();
	std::cout << out2 << "\n";

	// Decode
	Base64X::Decoder<std::string> d2;
	for (auto &it : out2) {
		std::string c;
		c.push_back(it);
		std::cout << d2.decode(c);
	}
	std::cout << "\n";

	// Example 3
	// Encode
	std::string buf0 = "roses are red";
	std::vector<uint8_t> buf1(buf0.begin(), buf0.end());
	auto out3 = Base64X::encode(buf1).as<std::string>();
	std::cout << out3 << "\n";

	auto out4 = Base64X::encode("violets are blue").as<std::vector<uint8_t>>();
	fwrite(out4.data(), 1, out4.size(), stdout);
	fputc('\n', stdout);

	// Decode
	auto dout3 = Base64X::decode(out3).as<std::string>();
	std::cout << dout3 << "\n";
	auto dout4 = Base64X::decode(out4).as<std::vector<uint8_t>>();
	fwrite(dout4.data(), 1, dout4.size(), stdout);
	fputc('\n', stdout);


	// Example 4
	// Encode
	std::vector<double> buf2 = {3.14159265357, 42.42, 233.233, 666.666};
	auto out5 = Base64X::encode(buf2).as<std::vector<uint8_t>>();
	fwrite(out5.data(), 1, out5.size(), stdout);
	fputc('\n', stdout);

	// Decode
	auto dout5 = Base64X::decode(out5).as_vector<double>();
	for (auto &it : dout5) {
		std::cout << it << " ";
	}
	std::cout << "\n";


}